

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

int addexpr(easm_expr **iex,easm_expr *expr,int flip)

{
  easm_expr *e1;
  easm_expr_type type;
  
  e1 = *iex;
  if (flip == 0) {
    if (e1 == (easm_expr *)0x0) goto LAB_0024e36b;
    type = EASM_EXPR_ADD;
  }
  else {
    if (e1 == (easm_expr *)0x0) {
      expr = easm_expr_un(EASM_EXPR_NEG,expr);
      goto LAB_0024e36b;
    }
    type = EASM_EXPR_SUB;
  }
  expr = easm_expr_bin(type,e1,expr);
LAB_0024e36b:
  *iex = expr;
  return 1;
}

Assistant:

int addexpr (struct easm_expr **iex, struct easm_expr *expr, int flip) {
	if (flip) {
		if (!*iex)
			*iex = easm_expr_un(EASM_EXPR_NEG, expr);
		else
			*iex = easm_expr_bin(EASM_EXPR_SUB, *iex, expr);
	} else {
		if (!*iex)
			*iex = expr;
		else
			*iex = easm_expr_bin(EASM_EXPR_ADD, *iex, expr);
	}
	return 1;
}